

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             *this,double value)

{
  iterator iVar1;
  basic_format_specs<wchar_t> *in_RDI;
  format_specs *in_stack_000002a0;
  double in_stack_000002a8;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *in_stack_000002b0;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *in_stack_ffffffffffffffb8;
  
  if (*(long *)&(in_RDI->super_core_format_specs).flags == 0) {
    basic_format_specs<wchar_t>::basic_format_specs(in_RDI);
  }
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  ::write_double<double>(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0);
  iVar1 = arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
          ::out(in_stack_ffffffffffffffb8);
  return (type)iVar1.container;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }